

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefaultReporter.cpp
# Opt level: O3

bool __thiscall
ApprovalTests::DefaultReporter::report(DefaultReporter *this,string *received,string *approved)

{
  pointer pcVar1;
  undefined1 uVar2;
  long *local_70;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_68;
  undefined1 *local_60 [2];
  undefined1 local_50 [16];
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  DefaultReporterFactory::getDefaultReporter();
  pcVar1 = (received->_M_dataplus)._M_p;
  local_40[0] = local_30;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)local_40,pcVar1,pcVar1 + received->_M_string_length);
  pcVar1 = (approved->_M_dataplus)._M_p;
  local_60[0] = local_50;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)local_60,pcVar1,pcVar1 + approved->_M_string_length);
  uVar2 = (**(code **)(*local_70 + 0x10))(local_70,local_40,local_60);
  if (local_60[0] != local_50) {
    operator_delete(local_60[0]);
  }
  if (local_40[0] != local_30) {
    operator_delete(local_40[0]);
  }
  if (local_68 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_68);
  }
  return (bool)uVar2;
}

Assistant:

bool DefaultReporter::report(std::string received, std::string approved) const
    {
        return DefaultReporterFactory::getDefaultReporter()->report(received, approved);
    }